

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O2

int __thiscall agg::bspline::init(bspline *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int extraout_EAX;
  long in_RCX;
  long in_RDX;
  long lVar1;
  
  if (2 < (int)ctx) {
    init(this,ctx);
    for (lVar1 = 0; (int)ctx != (int)lVar1; lVar1 = lVar1 + 1) {
      add_point(this,*(double *)(in_RDX + lVar1 * 8),*(double *)(in_RCX + lVar1 * 8));
    }
    prepare(this);
    in_EAX = extraout_EAX;
  }
  this->m_last_idx = -1;
  return in_EAX;
}

Assistant:

void bspline::init(int num, const double* x, const double* y)
    {
        if(num > 2)
        {
            init(num);
            int i;
            for(i = 0; i < num; i++)
            {
                add_point(*x++, *y++);
            }
            prepare();
        }
        m_last_idx = -1;
    }